

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void cbPlayback<short>(void *userData,uint8_t *stream,int len)

{
  short sVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  TPlaybackDataT<short> *data;
  long lVar5;
  long lVar6;
  
  if (*userData == '\0') {
    if (0 < len) {
      iVar4 = len + -2;
      if ((uint)len < 2) {
        iVar4 = 0;
      }
      memset(stream,0,(ulong)(iVar4 + 1U & 0xfffffffe) + 2);
      return;
    }
  }
  else {
    lVar5 = *(long *)((long)userData + 8);
    iVar4 = 0;
    lVar2 = (int)(0x400 / (long)*(int *)((long)userData + 4)) + lVar5;
    if (*(long *)((long)userData + 0x20) < lVar2) {
      lVar2 = *(long *)((long)userData + 0x20);
    }
    lVar6 = lVar5;
    if (lVar5 < lVar2) {
      do {
        sVar1 = *(short *)(*(long *)((long)userData + 0x18) + lVar5 * 2);
        *(short *)(stream + (long)iVar4 * 2) = sVar1;
        if (*(int *)((long)userData + 4) == 2) {
          *(short *)(stream + (long)(iVar4 + 1) * 2) =
               (short)(int)((double)(int)sVar1 * 0.5 +
                           (double)(int)*(short *)(*(long *)((long)userData + 0x18) + 2 + lVar5 * 2)
                           * 0.5);
          len = len + -4;
          iVar4 = iVar4 + 2;
        }
        else {
          len = len + -2;
          iVar4 = iVar4 + 1;
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar2;
      } while (lVar2 != lVar5);
    }
    if (0 < len) {
      uVar3 = len + 2;
      do {
        lVar5 = *(long *)((long)userData + 8);
        (stream + lVar6 * 2 + lVar5 * -2)[0] = '\0';
        (stream + lVar6 * 2 + lVar5 * -2)[1] = '\0';
        lVar6 = lVar6 + 1;
        uVar3 = uVar3 - 2;
      } while (2 < uVar3);
    }
    *(long *)((long)userData + 8) = lVar6;
  }
  return;
}

Assistant:

void cbPlayback(void * userData, uint8_t * stream, int len) {
    TPlaybackDataT<TSample> * data = (TPlaybackDataT<TSample> *)(userData);
    if (data->playing == false) {
        int offset = 0;
        TSample a = 0;
        while (len > 0) {
            memcpy(stream + offset*sizeof(a), &a, sizeof(a));
            len -= sizeof(a);
            ++offset;
        }
        return;
    }
    auto end = std::min(data->idx + TPlaybackDataT<TSample>::kSamples/data->slowDown, data->waveform.n);
    auto idx = data->idx;
    auto sidx = 0;
    for (; idx < end; ++idx) {
        TSample a = data->waveform.samples[idx];
        memcpy(stream + (sidx)*sizeof(a), &a, sizeof(a));
        len -= sizeof(a);
        ++sidx;

        if (data->slowDown == 2) {
            TSample a2 = data->waveform.samples[idx + 1];
            a = 0.5*a + 0.5*a2;
            memcpy(stream + (sidx)*sizeof(a), &a, sizeof(a));
            len -= sizeof(a);
            ++sidx;
        }
    }
    while (len > 0) {
        TSample a = 0;
        memcpy(stream + (idx - data->idx)*sizeof(a), &a, sizeof(a));
        len -= sizeof(a);
        ++idx;
    }
    data->idx = idx;
}